

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::~basic_bson_cursor
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  pointer ppVar3;
  pointer pcVar4;
  pointer puVar5;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor = pp_Var2;
  *(void **)(pp_Var2[-3] + (long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor) =
       vtt[1];
  (this->parser_).super_ser_context._vptr_ser_context =
       (_func_int **)&PTR__basic_bson_parser_00b302c0;
  ppVar3 = (this->parser_).state_stack_.
           super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (pointer)0x0) {
    operator_delete(ppVar3,(long)(this->parser_).state_stack_.
                                 super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar3);
  }
  pcVar4 = (this->parser_).text_buffer_._M_dataplus._M_p;
  paVar1 = &(this->parser_).text_buffer_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->parser_).name_buffer_._M_dataplus._M_p;
  paVar1 = &(this->parser_).name_buffer_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  puVar5 = (this->parser_).bytes_buffer_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->parser_).bytes_buffer_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
    return;
  }
  return;
}

Assistant:

~basic_bson_cursor() = default;